

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O0

void __thiscall
ylt::metric::dynamic_metric_manager<test_id_t<31UL>_>::clean_label_expired
          (dynamic_metric_manager<test_id_t<31UL>_> *this)

{
  long in_RDI;
  io_context_pool *this_00;
  shared_ptr<coro_io::io_context_pool> sp;
  weak_ptr<coro_io::period_timer> *in_stack_000000e8;
  dynamic_metric_manager<test_id_t<31UL>_> *in_stack_000000f0;
  shared_ptr<coro_io::io_context_pool> *in_stack_ffffffffffffff48;
  shared_ptr<coro_io::io_context_pool> *in_stack_ffffffffffffff50;
  shared_ptr<coro_io::io_context_pool> *this_01;
  Executor *ex;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  LazyBase<void,_true> *in_stack_ffffffffffffff90;
  shared_ptr<coro_io::io_context_pool> local_38 [2];
  
  ex = (Executor *)&stack0xffffffffffffffe8;
  coro_io::create_io_context_pool<coro_io::io_context_pool>(in_stack_ffffffffffffff8c);
  this_00 = (io_context_pool *)(in_RDI + 0x30);
  std::shared_ptr<coro_io::io_context_pool>::operator=
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::shared_ptr<coro_io::io_context_pool>::~shared_ptr
            ((shared_ptr<coro_io::io_context_pool> *)0x27bd05);
  std::shared_ptr<coro_io::io_context_pool>::shared_ptr
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::__shared_ptr_access<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x27bd21);
  coro_io::io_context_pool::get_executor(this_00);
  std::
  make_shared<coro_io::period_timer,coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>*>
            ((ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> **)
             this_00);
  this_01 = local_38;
  std::shared_ptr<coro_io::period_timer>::operator=
            ((shared_ptr<coro_io::period_timer> *)this_01,
             (shared_ptr<coro_io::period_timer> *)in_stack_ffffffffffffff48);
  std::shared_ptr<coro_io::period_timer>::~shared_ptr((shared_ptr<coro_io::period_timer> *)0x27bd6c)
  ;
  std::weak_ptr<coro_io::period_timer>::weak_ptr<coro_io::period_timer,void>
            ((weak_ptr<coro_io::period_timer> *)this_01,
             (shared_ptr<coro_io::period_timer> *)in_stack_ffffffffffffff48);
  check_label_expired(in_stack_000000f0,in_stack_000000e8);
  std::__shared_ptr_access<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x27bda4);
  coro_io::io_context_pool::get_executor(this_00);
  async_simple::coro::Lazy<void>::via((Lazy<void> *)this_00,ex);
  std::shared_ptr<coro_io::io_context_pool>::shared_ptr
            (this_01,(shared_ptr<coro_io::io_context_pool> *)&stack0xffffffffffffff80);
  async_simple::coro::detail::LazyBase<void,_true>::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_ylt_metric_metric_manager_hpp:467:16)>
            (in_stack_ffffffffffffff90,
             (type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  dynamic_metric_manager<test_id_t<31ul>>::clean_label_expired()::{lambda(auto:1&&)#1}::
  ~clean_label_expired((type *)0x27bdf0);
  async_simple::coro::RescheduleLazy<void>::~RescheduleLazy((RescheduleLazy<void> *)0x27bdfa);
  async_simple::coro::Lazy<void>::~Lazy((Lazy<void> *)0x27be04);
  std::weak_ptr<coro_io::period_timer>::~weak_ptr((weak_ptr<coro_io::period_timer> *)0x27be0e);
  std::shared_ptr<coro_io::io_context_pool>::~shared_ptr
            ((shared_ptr<coro_io::io_context_pool> *)0x27be1b);
  return;
}

Assistant:

void clean_label_expired() {
    executor_ = coro_io::create_io_context_pool(1);
    auto sp = executor_;
    timer_ = std::make_shared<coro_io::period_timer>(executor_->get_executor());
    check_label_expired(timer_)
        .via(executor_->get_executor())
        .start([sp](auto&&) {
        });
  }